

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  int iVar1;
  Descriptor *pDVar2;
  char *pcVar3;
  int __c;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *this_00;
  string_view text;
  string local_80;
  string local_60;
  AlphaNum local_40;
  
  pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
  iVar1 = 0;
  if (pDVar2 == (Descriptor *)0x0) {
    this_00 = this->descriptor_;
    UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_80,(java *)this_00,field);
    pcVar3 = FieldDescriptor::index(this->descriptor_,(char *)this_00,__c);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_40,(int)pcVar3);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_60,(lts_20250127 *)&local_40,a);
    text._M_str = "$name$.internalInit(descriptor.getExtensions().get($index$));\n";
    text._M_len = 0x3e;
    io::Printer::Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,text,(char (*) [5])0x651c1c,&local_80,(char (*) [6])0x41e1cd,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    iVar1 = 0x15;
  }
  return iVar1;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == nullptr) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCaseCheckReserved(descriptor_), "index",
        absl::StrCat(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}